

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  bool bVar1;
  int iVar2;
  PortInfo **ppPVar3;
  reference puVar4;
  RTPMemoryManager *pRVar5;
  PortInfo *pPVar6;
  PortInfo *pPStack_70;
  int status;
  PortInfo *portinf_1;
  iterator local_60;
  _List_const_iterator<unsigned_short> local_58;
  iterator local_50;
  _List_const_iterator<unsigned_short> local_48;
  _List_const_iterator<unsigned_short> local_40;
  const_iterator end;
  const_iterator begin;
  const_iterator it;
  PortInfo *portinf;
  uint16_t port_local;
  RTPUDPv4Transmitter *pRStack_18;
  uint32_t ip_local;
  RTPUDPv4Transmitter *this_local;
  
  portinf._2_2_ = port;
  portinf._4_4_ = ip;
  pRStack_18 = this;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::GotoElement(&this->acceptignoreinfo,(uint *)((long)&portinf + 4));
  bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
          ::HasCurrentElement(&this->acceptignoreinfo);
  if (bVar1) {
    ppPVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              ::GetCurrentElement(&this->acceptignoreinfo);
    pPVar6 = *ppPVar3;
    if (portinf._2_2_ == 0) {
      pPVar6->all = true;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar6->portlist);
    }
    else if ((pPVar6->all & 1U) == 0) {
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_40);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (&pPVar6->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_48,&local_50);
      end._M_node = local_48._M_node;
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                     (&pPVar6->portlist);
      std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_58,&local_60);
      local_40._M_node = local_58._M_node;
      begin = end;
      while (bVar1 = std::operator!=(&begin,&local_40), bVar1) {
        puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin);
        if (*puVar4 == portinf._2_2_) {
          return 0;
        }
        portinf_1 = (PortInfo *)std::_List_const_iterator<unsigned_short>::operator++(&begin,0);
      }
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                (&pPVar6->portlist,(value_type_conflict2 *)((long)&portinf + 2));
    }
  }
  else {
    pRVar5 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    pPVar6 = (PortInfo *)operator_new(0x20,pRVar5,0xc);
    PortInfo::PortInfo(pPVar6);
    pPStack_70 = pPVar6;
    if (portinf._2_2_ == 0) {
      pPVar6->all = true;
    }
    else {
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_front
                (&pPVar6->portlist,(value_type_conflict2 *)((long)&portinf + 2));
    }
    iVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            ::AddElement(&this->acceptignoreinfo,(uint *)((long)&portinf + 4),
                         &stack0xffffffffffffff90);
    pPVar6 = pPStack_70;
    if (iVar2 < 0) {
      pRVar5 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>(pPVar6,pRVar5);
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}

	return 0;
}